

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O3

void cache_create(size_t _cache_size,size_t _max_size)

{
  if (((int)POPCOUNT(_cache_size) == 1) && ((int)POPCOUNT(_max_size) == 1)) {
    cache_mask = _cache_size - 1;
    cache_size = _cache_size;
    cache_max = _max_size;
    if (_cache_size <= _max_size) {
      cache_table = (cache_entry_t)
                    mmap((void *)0x0,_max_size * 0x20 + 0x3f & 0xffffffffffffffc0,3,0x22,-1,0);
      if (cache_table == (cache_entry_t)0xffffffffffffffff) {
        cache_table = (cache_entry_t)0x0;
      }
      cache_status = (uint32_t *)
                     mmap((void *)0x0,cache_max * 4 + 0x3f & 0xffffffffffffffc0,3,0x22,-1,0);
      if ((cache_entry_t)cache_status == (cache_entry_t)0xffffffffffffffff) {
        cache_status = (uint32_t *)(cache_entry_t)0x0;
      }
      if ((cache_table != (cache_entry_t)0x0) && ((cache_entry_t)cache_status != (cache_entry_t)0x0)
         ) {
        LOCK();
        next_opid = 0x2000000000000;
        UNLOCK();
        return;
      }
      goto LAB_00106431;
    }
  }
  else {
    cache_create_cold_1();
  }
  cache_create_cold_3();
LAB_00106431:
  cache_create_cold_2();
}

Assistant:

void
cache_create(size_t _cache_size, size_t _max_size)
{
#if CACHE_MASK
    // Cache size must be a power of 2
    if (__builtin_popcountll(_cache_size) != 1 || __builtin_popcountll(_max_size) != 1) {
        fprintf(stderr, "cache_create: Table size must be a power of 2!\n");
        exit(1);
    }
#endif

    cache_size = _cache_size;
    cache_max  = _max_size;
#if CACHE_MASK
    cache_mask = cache_size - 1;
#endif

    if (cache_size > cache_max) {
        fprintf(stderr, "cache_create: Table size must be <= max size!\n");
        exit(1);
    }

    cache_table = (cache_entry_t)alloc_aligned(cache_max * sizeof(struct cache_entry));
    cache_status = (uint32_t*)alloc_aligned(cache_max * sizeof(uint32_t));
    if (cache_table == 0 || cache_status == 0) {
        fprintf(stderr, "cache_create: Unable to allocate memory: %s!\n", strerror(errno));
        exit(1);
    }

    next_opid = 512LL << 40;
}